

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

bool __thiscall
Clasp::SatPreprocessor::preprocess(SatPreprocessor *this,SharedContext *ctx,Options *opts)

{
  ClauseList *pCVar1;
  byte bVar2;
  uint uVar3;
  Literal x;
  Solver *this_00;
  pointer pLVar4;
  pointer pPVar5;
  pointer pVVar6;
  pointer pVVar7;
  pointer puVar8;
  Options OVar9;
  pointer ppCVar10;
  Clause *pCVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  SatPreprocessor *pSVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  long lVar19;
  uint32 uVar20;
  long *plVar21;
  uint uVar22;
  void *mem;
  Result RVar23;
  Freeze act;
  OnExit onExit;
  uint local_64;
  ClauseRep local_58;
  OnExit local_48;
  
  this->ctx_ = ctx;
  this->opts_ = opts;
  this_00 = *(ctx->solvers_).ebo_.buf;
  local_48.rest = (SatPreprocessor *)0x0;
  pSVar15 = (SatPreprocessor *)((ctx->satPrepro).ptr_ & 0xfffffffffffffffe);
  if (pSVar15 == this) {
    (ctx->satPrepro).ptr_ = (uintp)pSVar15;
    local_48.rest = pSVar15;
  }
  uVar16 = (ulong)(this->units_).ebo_.size;
  local_48.ctx = ctx;
  local_48.self = this;
  if (uVar16 != 0) {
    pLVar4 = (this->units_).ebo_.buf;
    lVar19 = 0;
    do {
      bVar12 = SharedContext::addUnary(ctx,(Literal)*(uint32 *)((long)&pLVar4->rep_ + lVar19));
      if (!bVar12) goto LAB_0016096e;
      lVar19 = lVar19 + 4;
    } while (uVar16 << 2 != lVar19);
  }
  (this->units_).ebo_.size = 0;
  bVar12 = Solver::propagate(this_00);
  if (bVar12) {
    if (((ctx->share_).field_0x3 & 8) != 0) {
      *opts = (Options)((ulong)*opts & 0xfffffffffffffffc | (ulong)(((ulong)*opts & 3) != 0));
    }
    if (((ctx->share_).field_0x3 & 0x10) != 0) {
      uVar16 = (ulong)(ctx->output).preds_.ebo_.size;
      if (uVar16 != 0) {
        pPVar5 = (ctx->output).preds_.ebo_.buf;
        pVVar6 = (ctx->varInfo_).ebo_.buf;
        uVar20 = (ctx->stats_).vars.frozen;
        lVar19 = 0;
        do {
          uVar22 = *(uint *)((long)&(pPVar5->cond).rep_ + lVar19);
          if (3 < uVar22) {
            uVar22 = uVar22 >> 2;
            bVar2 = pVVar6[uVar22].rep;
            if ((bVar2 & 0x40) == 0) {
              pVVar6[uVar22].rep = bVar2 | 0x40;
              uVar20 = uVar20 + 1;
              (ctx->stats_).vars.frozen = uVar20;
            }
          }
          lVar19 = lVar19 + 0x10;
        } while (uVar16 << 4 != lVar19);
      }
      uVar22 = (ctx->output).vars_.lo;
      uVar3 = (ctx->output).vars_.hi;
      if (uVar22 != uVar3) {
        pVVar6 = (ctx->varInfo_).ebo_.buf;
        uVar20 = (ctx->stats_).vars.frozen;
        do {
          if (uVar22 != 0) {
            bVar2 = pVVar6[uVar22].rep;
            if ((bVar2 & 0x40) == 0) {
              pVVar6[uVar22].rep = bVar2 | 0x40;
              uVar20 = uVar20 + 1;
              (ctx->stats_).vars.frozen = uVar20;
            }
          }
          uVar22 = uVar22 + 1;
        } while (uVar3 != uVar22);
      }
    }
    if (((ctx->share_).field_0x3 & 0x20) != 0) {
      uVar16 = (ulong)(ctx->heuristic).entries_.ebo_.size;
      if (uVar16 != 0) {
        pVVar7 = (ctx->heuristic).entries_.ebo_.buf;
        puVar8 = ((*(ctx->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf;
        pVVar6 = (ctx->varInfo_).ebo_.buf;
        uVar20 = (ctx->stats_).vars.frozen;
        lVar19 = 0;
        do {
          uVar18 = *(ulong *)(&pVVar7->field_0x0 + lVar19);
          if (((uVar18 & 0x3fffffff00000000) != 0) &&
             ((byte)(*(byte *)((long)puVar8 + (ulong)((int)uVar18 * 2 & 0xfffffffc)) & 3) !=
              (byte)(2 - ((byte)uVar18 & 1)))) {
            uVar22 = (uint)(uVar18 >> 0x20) & 0x3fffffff;
            bVar2 = pVVar6[uVar22].rep;
            if ((bVar2 & 0x40) == 0) {
              pVVar6[uVar22].rep = bVar2 | 0x40;
              uVar20 = uVar20 + 1;
              (ctx->stats_).vars.frozen = uVar20;
            }
          }
          lVar19 = lVar19 + 0xc;
        } while (uVar16 * 0xc != lVar19);
      }
      local_58._0_8_ = &PTR__DefaultAction_001ea7a8;
      plVar21 = (long *)((ctx->config_).ptr_ & 0xfffffffffffffffe);
      local_58.lits = (Literal *)ctx;
      puVar17 = (ulong *)(**(code **)(*plVar21 + 0x30))(plVar21,0);
      uVar22 = 0x80000000;
      if (((*puVar17 & 0x700000000) == 0x400000000) && (0x1fffffff < (uint)puVar17[1])) {
        uVar22 = (uint)puVar17[1] >> 0x18 & 0x1f;
      }
      DomainTable::applyDefault(ctx,(DefaultAction *)&local_58,uVar22);
    }
    OVar9 = *opts;
    if (((ulong)OVar9 & 0xfe000000) == 0) {
LAB_001607b5:
      bVar12 = false;
    }
    else {
      uVar22 = (this->ctx_->stats_).vars.frozen;
      if (uVar22 == 0) goto LAB_001607b5;
      uVar16 = (ulong)(this_00->assign_).trail.ebo_.size;
      if (uVar16 != 0) {
        lVar19 = 0;
        do {
          uVar22 = uVar22 + (int)((char)((this->ctx_->varInfo_).ebo_.buf
                                         [*(uint *)((long)&((this_00->assign_).trail.ebo_.buf)->rep_
                                                   + lVar19) >> 2].rep * '\x02') >> 7);
          lVar19 = lVar19 + 4;
        } while (uVar16 << 2 != lVar19);
      }
      bVar12 = (double)((uint)((ulong)OVar9 >> 0x19) & 0x7f) <
               ((double)uVar22 /
               (double)(~((this_00->assign_).elims_ + (this_00->assign_).trail.ebo_.size) +
                       (this_00->assign_).assign_.ebo_.size)) * 100.0;
    }
    if (((((ulong)OVar9 & 3) == 0) ||
        ((OVar9._4_4_ & 0xffff) * 1000 < (this->clauses_).ebo_.size &&
         ((ulong)OVar9 & 0xffff00000000) != 0 || bVar12)) ||
       (iVar14 = (*this->_vptr_SatPreprocessor[3])(this,opts), (char)iVar14 == '\0')) {
LAB_001608d4:
      bVar12 = Solver::simplify(this_00);
      if (bVar12) {
        pCVar1 = &this->clauses_;
        if ((this->clauses_).ebo_.size != 0) {
          uVar22 = 0;
          do {
            pCVar11 = (pCVar1->ebo_).buf[uVar22];
            if (pCVar11 != (Clause *)0x0) {
              local_58.lits = pCVar11->lits_;
              local_58._0_8_ = (ulong)(*(uint *)&pCVar11->field_0x8 & 0x3fffffff) << 0x20;
              RVar23 = ClauseCreator::create(this_00,&local_58,0);
              if (((undefined1  [16])RVar23 & (undefined1  [16])0x2) != (undefined1  [16])0x0)
              goto LAB_0016096e;
              (pCVar1->ebo_).buf[uVar22] = (Clause *)0x0;
              operator_delete(pCVar11);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != (this->clauses_).ebo_.size);
        }
        ppCVar10 = (pCVar1->ebo_).buf;
        (pCVar1->ebo_).buf = (pointer)0x0;
        (this->clauses_).ebo_.size = 0;
        (this->clauses_).ebo_.cap = 0;
        bVar12 = true;
        if (ppCVar10 != (pointer)0x0) {
          operator_delete(ppCVar10);
        }
        goto LAB_00160970;
      }
    }
    else {
      bVar12 = (this->clauses_).ebo_.size == 0;
      if (bVar12) {
        local_64 = 0;
      }
      else {
        uVar16 = 0;
        local_64 = 0;
        do {
          ppCVar10 = (this->clauses_).ebo_.buf;
          pCVar11 = ppCVar10[uVar16];
          ppCVar10[uVar16] = (Clause *)0x0;
          Clause::simplify(pCVar11,this_00);
          x.rep_ = pCVar11->lits_[0].rep_;
          if ((*(byte *)((long)(this_00->assign_).assign_.ebo_.buf + (ulong)(x.rep_ & 0xfffffffc)) &
              3) == 0) {
            uVar18 = (ulong)local_64;
            local_64 = local_64 + 1;
            (this->clauses_).ebo_.buf[uVar18] = pCVar11;
            bVar13 = true;
          }
          else {
            operator_delete(pCVar11);
            bVar13 = SharedContext::addUnary(ctx,x);
          }
          if (bVar13 == false) break;
          uVar22 = (int)uVar16 + 1;
          uVar16 = (ulong)uVar22;
          bVar12 = uVar22 == (this->clauses_).ebo_.size;
        } while (!bVar12);
      }
      if (bVar12) {
        (this->clauses_).ebo_.size = local_64;
        freezeSeen(this);
        bVar12 = Solver::propagate(this_00);
        if ((bVar12) && (iVar14 = (*this->_vptr_SatPreprocessor[4])(this), (char)iVar14 != '\0'))
        goto LAB_001608d4;
      }
    }
  }
LAB_0016096e:
  bVar12 = false;
LAB_00160970:
  preprocess::OnExit::~OnExit(&local_48);
  return bVar12;
}

Assistant:

bool SatPreprocessor::preprocess(SharedContext& ctx, Options& opts) {
	ctx_  = &ctx;
	opts_ = &opts;
	Solver* s = ctx_->master();
	struct OnExit {
		SharedContext*   ctx;
		SatPreprocessor* self;
		SatPreprocessor* rest;
		OnExit(SatPreprocessor* s, SharedContext* c) : ctx(c), self(s), rest(0) {
			if (ctx && ctx->satPrepro.get() == s) { rest = ctx->satPrepro.release(); }
		}
		~OnExit() {
			if (self) self->cleanUp();
			if (rest) ctx->satPrepro.reset(rest);
		}
	} onExit(this, &ctx);
	for (LitVec::const_iterator it = units_.begin(), end = units_.end(); it != end; ++it) {
		if (!ctx.addUnary(*it)) return false;
	}
	units_.clear();
	// skip preprocessing if other constraints are UNSAT
	if (!s->propagate()) return false;
	if (ctx.preserveModels()) {
		opts.disableBce();
	}
	if (ctx.preserveShown()) {
		for (OutputTable::pred_iterator it = ctx.output.pred_begin(), end = ctx.output.pred_end(); it != end; ++it) {
			ctx.setFrozen(it->cond.var(), true);
		}
		for (OutputTable::range_iterator it = ctx.output.vars_begin(), end = ctx.output.vars_end(); it != end; ++it) {
			ctx.setFrozen(*it, true);
		}
	}
	if (ctx.preserveHeuristic()) {
		for (DomainTable::iterator it = ctx.heuristic.begin(), end = ctx.heuristic.end(); it != end; ++it) {
			if (!ctx.master()->isFalse(it->cond())) {
				ctx.setFrozen(it->var(), true);
			}
		}
		struct Freeze : DomainTable::DefaultAction {
			explicit Freeze(SharedContext& c) : ctx(&c) {}
			void atom(Literal p, HeuParams::DomPref, uint32) { ctx->setFrozen(p.var(), true); }
			SharedContext* ctx;
		} act(ctx);
		DomainTable::applyDefault(ctx, act, ctx.defaultDomPref());
	}

	// preprocess only if not too many vars are frozen or not too many clauses
	bool limFrozen = false;
	if (opts.limFrozen != 0 && ctx_->stats().vars.frozen) {
		uint32 varFrozen = ctx_->stats().vars.frozen;
		for (LitVec::const_iterator it = s->trail().begin(), end = s->trail().end(); it != end; ++it) {
 			varFrozen -= (ctx_->varInfo(it->var()).frozen());
 		}
		limFrozen = ((varFrozen / double(s->numFreeVars())) * 100.0) > double(opts.limFrozen);
	}
	// 1. remove SAT-clauses, strengthen clauses w.r.t false literals, attach
	if (opts.type != 0 && !opts.clauseLimit(numClauses()) && !limFrozen && initPreprocess(opts)) {
		ClauseList::size_type j = 0;
		for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
			Clause* c   = clauses_[i]; assert(c);
			clauses_[i] = 0;
			c->simplify(*s);
			Literal x   = (*c)[0];
			if (s->value(x.var()) == value_free) {
				clauses_[j++] = c;
			}
			else {
				c->destroy();
				if (!ctx.addUnary(x)) { return false; }
			}
		}
		clauses_.erase(clauses_.begin()+j, clauses_.end());
		// 2. run preprocessing
		freezeSeen();
		if (!s->propagate() || !doPreprocess()) {
			return false;
		}
	}
	// simplify other constraints w.r.t any newly derived top-level facts
	if (!s->simplify()) return false;
	// 3. move preprocessed clauses to ctx
	for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
		if (Clause* c = clauses_[i]) {
			if (!ClauseCreator::create(*s, ClauseRep::create(&(*c)[0], c->size()), 0)) {
				return false;
			}
			clauses_[i] = 0;
			c->destroy();
		}
	}
	ClauseList().swap(clauses_);
	return true;
}